

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

void learn_sup_adf<true>(warm_cb *data,example *ec,int ec_type)

{
  uint64_t *puVar1;
  label_t *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  wclass *pwVar7;
  wclass *pwVar8;
  label *plVar9;
  example *peVar10;
  pointer ppeVar11;
  label_t lVar12;
  label_t lVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  multi_learner *pmVar17;
  pointer ppeVar18;
  ulong uVar19;
  float *__args;
  wclass *pwVar20;
  multi_ex *__range1;
  float fVar21;
  float fVar22;
  vector<float,_std::allocator<float>_> old_weights;
  void *local_48;
  iterator iStack_40;
  float *local_38;
  
  copy_example_to_adf(data,ec);
  if (data->num_actions != 0) {
    uVar19 = 0;
    do {
      uVar15 = uVar19 + 1;
      (data->csls[uVar19].costs._begin)->class_index = (uint32_t)uVar15;
      pwVar7 = (ec->l).cs.costs._begin;
      pwVar8 = (ec->l).cs.costs._end;
      if (pwVar7 == pwVar8) {
        fVar21 = 0.0;
      }
      else {
        fVar21 = 0.0;
        do {
          pwVar20 = pwVar7 + 1;
          if (pwVar7->class_index == (uint32_t)uVar15) {
            fVar21 = pwVar7->x;
            break;
          }
          pwVar7 = pwVar20;
        } while (pwVar20 != pwVar8);
      }
      (data->csls[uVar19].costs._begin)->x = (data->loss1 - data->loss0) * fVar21 + data->loss0;
      uVar19 = uVar15;
    } while (uVar15 < data->num_actions);
  }
  if (data->num_actions != 0) {
    lVar16 = 0;
    uVar19 = 0;
    do {
      plVar9 = data->cbls;
      peVar10 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
      lVar12 = (peVar10->l).multi;
      lVar13 = *(label_t *)&(peVar10->l).cs.costs._end;
      sVar14 = (peVar10->l).cs.costs.erase_count;
      puVar3 = (undefined8 *)((long)&(plVar9->costs).end_array + lVar16);
      *puVar3 = (peVar10->l).cs.costs.end_array;
      puVar3[1] = sVar14;
      plVar2 = (label_t *)((long)&(plVar9->costs)._begin + lVar16);
      *plVar2 = lVar12;
      plVar2[1] = lVar13;
      peVar10 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
      plVar2 = (label_t *)((long)&(data->csls->costs)._begin + lVar16);
      lVar12 = *plVar2;
      lVar13 = plVar2[1];
      puVar3 = (undefined8 *)((long)&(data->csls->costs).end_array + lVar16);
      sVar14 = puVar3[1];
      (peVar10->l).cs.costs.end_array = (wclass *)*puVar3;
      (peVar10->l).cs.costs.erase_count = sVar14;
      (peVar10->l).multi = lVar12;
      *(label_t *)&(peVar10->l).cs.costs._end = lVar13;
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar19 < data->num_actions);
  }
  local_48 = (void *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_38 = (float *)0x0;
  if (data->num_actions != 0) {
    uVar19 = 0;
    do {
      __args = &(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19]->weight;
      if (iStack_40._M_current == local_38) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_48,iStack_40,__args);
      }
      else {
        *iStack_40._M_current = *__args;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < data->num_actions);
  }
  if (data->choices_lambda != 0) {
    uVar19 = 0;
    do {
      uVar4 = data->ws_train_size;
      uVar5 = data->inter_period;
      fVar21 = (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      fVar22 = 1.0 - fVar21;
      if (ec_type != 1) {
        fVar22 = fVar21;
      }
      if (data->num_actions != 0) {
        uVar15 = 0;
        do {
          (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15]->weight =
               *(float *)((long)local_48 + uVar15 * 4) *
               ((((float)uVar4 + (float)uVar5) * fVar22) /
               ((1.0 - fVar21) * (float)uVar4 + fVar21 * (float)uVar5 + 1.1754944e-38));
          uVar15 = uVar15 + 1;
        } while (uVar15 < data->num_actions);
      }
      pmVar17 = LEARNER::as_multiline<char,char>(data->all->cost_sensitive);
      ppeVar18 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar11 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppeVar18 != ppeVar11) {
        iVar6 = *(int *)(pmVar17 + 0xe0);
        do {
          puVar1 = &((*ppeVar18)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(iVar6 * (int)uVar19);
          ppeVar18 = ppeVar18 + 1;
        } while (ppeVar18 != ppeVar11);
      }
      (**(code **)(pmVar17 + 0x28))
                (*(undefined8 *)(pmVar17 + 0x18),*(undefined8 *)(pmVar17 + 0x20),&data->ecs);
      ppeVar18 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar11 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppeVar18 != ppeVar11) {
        iVar6 = *(int *)(pmVar17 + 0xe0);
        do {
          puVar1 = &((*ppeVar18)->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(iVar6 * (int)uVar19);
          ppeVar18 = ppeVar18 + 1;
        } while (ppeVar18 != ppeVar11);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < data->choices_lambda);
  }
  if (data->num_actions != 0) {
    uVar19 = 0;
    do {
      (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar19]->weight = *(float *)((long)local_48 + uVar19 * 4);
      uVar19 = uVar19 + 1;
    } while (uVar19 < data->num_actions);
  }
  if (data->num_actions != 0) {
    lVar16 = 0;
    uVar19 = 0;
    do {
      peVar10 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
      plVar2 = (label_t *)((long)&(data->cbls->costs)._begin + lVar16);
      lVar12 = *plVar2;
      lVar13 = plVar2[1];
      puVar3 = (undefined8 *)((long)&(data->cbls->costs).end_array + lVar16);
      sVar14 = puVar3[1];
      (peVar10->l).cs.costs.end_array = (wclass *)*puVar3;
      (peVar10->l).cs.costs.erase_count = sVar14;
      (peVar10->l).multi = lVar12;
      *(label_t *)&(peVar10->l).cs.costs._end = lVar13;
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar19 < data->num_actions);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void learn_sup_adf(warm_cb& data, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);
	//generate cost-sensitive label (for cost-sensitive learner's temporary use)
	auto& csls = data.csls;
	auto& cbls = data.cbls;
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		csls[a].costs[0].class_index = a+1;
		if (use_cs)
			csls[a].costs[0].x = loss_cs(data, ec.l.cs.costs, a+1);
 		else
			csls[a].costs[0].x = loss(data, ec.l.multi.label, a+1);
	}
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		cbls[a] = data.ecs[a]->l.cb;
		data.ecs[a]->l.cs = csls[a];
	}

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
		for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
		multi_learner* cs_learner = as_multiline(data.all->cost_sensitive);
		cs_learner->learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->l.cb = cbls[a];
}